

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

char * getobjname(Proto *p,int lastpc,int reg,char **name)

{
  uint uVar1;
  Instruction *pIVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  
  uVar8 = (ulong)(uint)lastpc;
LAB_001297a0:
  iVar5 = (int)uVar8;
  pcVar6 = luaF_getlocalname(p,reg + 1,iVar5);
  *name = pcVar6;
  if (pcVar6 != (char *)0x0) {
    return "local";
  }
  pIVar2 = p->code;
  uVar7 = ((char)"\b\n\n\t\t\b\b\b\b\b"[pIVar2[iVar5] & 0x7f] >> 7) + iVar5;
  if (uVar7 != 0 &&
      SCARRY4((int)((char)"\b\n\n\t\t\b\b\b\b\b"[pIVar2[iVar5] & 0x7f] >> 7),iVar5) ==
      (int)uVar7 < 0) {
    uVar9 = 0;
    uVar8 = 0xffffffff;
    iVar5 = 0;
    do {
      uVar1 = pIVar2[uVar9];
      uVar12 = uVar1 & 0x7f;
      uVar10 = uVar1 >> 7 & 0xff;
      if (uVar12 < 0x44) {
        if (uVar12 == 8) {
          if (((int)uVar10 <= reg) && ((uint)reg <= uVar10 + (uVar1 >> 0x10 & 0xff)))
          goto LAB_00129875;
        }
        else {
          if (uVar12 != 0x38) goto LAB_00129866;
          iVar11 = (int)uVar9 + (uVar1 >> 7) + -0xfffffe;
          iVar4 = iVar5;
          if (iVar5 < iVar11) {
            iVar4 = iVar11;
          }
          if (iVar11 <= (int)uVar7) {
            iVar5 = iVar4;
          }
        }
      }
      else {
        if (1 < uVar12 - 0x44) {
          if (uVar12 != 0x4c) {
LAB_00129866:
            if ((uVar10 == reg) && (("\b\n\n\t\t\b\b\b\b\b"[uVar12] & 8) != 0)) goto LAB_00129875;
            goto LAB_00129880;
          }
          uVar10 = uVar10 + 2;
        }
        if ((int)uVar10 <= reg) {
LAB_00129875:
          uVar8 = uVar9 & 0xffffffff;
          if ((long)uVar9 < (long)iVar5) {
            uVar8 = 0xffffffff;
          }
        }
      }
LAB_00129880:
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
    iVar5 = (int)uVar8;
    if (iVar5 != -1) {
      uVar7 = pIVar2[iVar5];
      if ((uVar7 & 0x7f) == 0) goto code_r0x001298a4;
      pcVar6 = (char *)0x0;
      switch(uVar7 & 0x7f) {
      case 3:
        uVar7 = uVar7 >> 0xf;
        break;
      case 4:
        uVar7 = pIVar2[(long)iVar5 + 1] >> 7;
        break;
      default:
        goto switchD_001298e7_caseD_5;
      case 9:
        lVar3 = *(long *)((long)&p->upvalues->name + (ulong)(uVar7 >> 0xc & 0xff0));
        pcVar6 = "?";
        if (lVar3 != 0) {
          pcVar6 = (char *)(lVar3 + 0x18);
        }
        *name = pcVar6;
        return "upvalue";
      case 0xb:
        uVar8 = (ulong)(uVar7 >> 0x14 & 0xfffffff0);
        pcVar6 = "?";
        if (((&p->k->tt_)[uVar8] & 0xf) == 4) {
          pcVar6 = (char *)(*(long *)((long)&p->k->value_ + uVar8) + 0x18);
        }
        *name = pcVar6;
        lVar3 = *(long *)((long)&p->upvalues->name + (ulong)(uVar7 >> 0xc & 0xff0));
        pcVar6 = (char *)(lVar3 + 0x18);
        if (lVar3 == 0) {
          pcVar6 = "?";
        }
        iVar5 = strcmp(pcVar6,"_ENV");
        if (iVar5 != 0) {
          return "field";
        }
        return "global";
      case 0xc:
        pcVar6 = getobjname(p,iVar5,uVar7 >> 0x18,name);
        if ((pcVar6 != (char *)0x0) && (*pcVar6 == 'c')) goto LAB_001299c9;
LAB_001299bb:
        pcVar6 = "?";
        goto LAB_001299c2;
      case 0xd:
        *name = "integer index";
        return "field";
      case 0xe:
        uVar8 = (ulong)(uVar7 >> 0x14 & 0xfffffff0);
        if (((&p->k->tt_)[uVar8] & 0xf) != 4) goto LAB_001299bb;
        pcVar6 = (char *)(*(long *)((long)&p->k->value_ + uVar8) + 0x18);
LAB_001299c2:
        *name = pcVar6;
LAB_001299c9:
        pcVar6 = gxf(p,iVar5,uVar7,0);
        return pcVar6;
      case 0x14:
        if ((short)uVar7 < 0) {
          uVar8 = (ulong)((uVar7 >> 0x18) << 4);
          if (((&p->k->tt_)[uVar8] & 0xf) != 4) goto LAB_00129adf;
          pcVar6 = (char *)(*(long *)((long)&p->k->value_ + uVar8) + 0x18);
LAB_00129ae6:
          *name = pcVar6;
        }
        else {
          pcVar6 = getobjname(p,iVar5,uVar7 >> 0x18,name);
          if ((pcVar6 == (char *)0x0) || (*pcVar6 != 'c')) {
LAB_00129adf:
            pcVar6 = "?";
            goto LAB_00129ae6;
          }
        }
        pcVar6 = "method";
        goto switchD_001298e7_caseD_5;
      }
      if (((&p->k->tt_)[uVar7 << 4] & 0xf) == 4) {
        *name = (char *)(*(long *)((long)&p->k->value_ + (ulong)(uVar7 << 4)) + 0x18);
        return "constant";
      }
    }
  }
  goto LAB_00129a35;
code_r0x001298a4:
  reg = uVar7 >> 0x10 & 0xff;
  if ((uVar7 >> 7 & 0xff) <= (uint)reg) {
LAB_00129a35:
    pcVar6 = (char *)0x0;
switchD_001298e7_caseD_5:
    return pcVar6;
  }
  goto LAB_001297a0;
}

Assistant:

static const char *getobjname (const Proto *p, int lastpc, int reg,
                               const char **name) {
  int pc;
  *name = luaF_getlocalname(p, reg + 1, lastpc);
  if (*name)  /* is a local? */
    return "local";
  /* else try symbolic execution */
  pc = findsetreg(p, lastpc, reg);
  if (pc != -1) {  /* could find instruction? */
    Instruction i = p->code[pc];
    OpCode op = GET_OPCODE(i);
    switch (op) {
      case OP_MOVE: {
        int b = GETARG_B(i);  /* move from 'b' to 'a' */
        if (b < GETARG_A(i))
          return getobjname(p, pc, b, name);  /* get name for 'b' */
        break;
      }
      case OP_GETTABUP: {
        int k = GETARG_C(i);  /* key index */
        kname(p, k, name);
        return gxf(p, pc, i, 1);
      }
      case OP_GETTABLE: {
        int k = GETARG_C(i);  /* key index */
        rname(p, pc, k, name);
        return gxf(p, pc, i, 0);
      }
      case OP_GETI: {
        *name = "integer index";
        return "field";
      }
      case OP_GETFIELD: {
        int k = GETARG_C(i);  /* key index */
        kname(p, k, name);
        return gxf(p, pc, i, 0);
      }
      case OP_GETUPVAL: {
        *name = upvalname(p, GETARG_B(i));
        return "upvalue";
      }
      case OP_LOADK:
      case OP_LOADKX: {
        int b = (op == OP_LOADK) ? GETARG_Bx(i)
                                 : GETARG_Ax(p->code[pc + 1]);
        if (ttisstring(&p->k[b])) {
          *name = svalue(&p->k[b]);
          return "constant";
        }
        break;
      }
      case OP_SELF: {
        rkname(p, pc, i, name);
        return "method";
      }
      default: break;  /* go through to return NULL */
    }
  }
  return NULL;  /* could not find reasonable name */
}